

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,string *bech32_hrp)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  NetType_conflict NVar3;
  undefined1 local_78 [8];
  pointer puStack_70;
  pointer local_68;
  SchnorrPubkey *local_58;
  Pubkey *local_50;
  ByteData *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  NVar3 = kCfdConnectionError;
  if (bech32_hrp->_M_string_length == 0) {
    NVar3 = type;
  }
  this->type_ = NVar3;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  local_40 = &(this->address_).field_2;
  (this->address_)._M_dataplus._M_p = (pointer)local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->address_,"");
  local_38 = &this->address_;
  ByteData::ByteData(&this->hash_);
  local_50 = &this->pubkey_;
  local_48 = &this->hash_;
  Pubkey::Pubkey(local_50);
  local_58 = &this->schnorr_pubkey_;
  SchnorrPubkey::SchnorrPubkey(local_58);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_,tree);
  Script::Script(&this->redeem_script_);
  p_Var1 = &(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl = 0;
  *(undefined8 *)&(this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_data_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  TapBranch::GetTweakedPubkey
            ((SchnorrPubkey *)local_78,&tree->super_TapBranch,internal_pubkey,(bool *)0x0);
  puVar2 = (this->schnorr_pubkey_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_78;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_70;
  (this->schnorr_pubkey_).data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_68;
  local_78 = (undefined1  [8])0x0;
  puStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78);
    }
  }
  CalculateTaproot(this,bech32_hrp);
  local_78 = (undefined1  [8])0x586012;
  puStack_70 = (pointer)CONCAT44(puStack_70._4_4_,0x26d);
  local_68 = "Address";
  logger::log<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_78,kCfdLogLevelInfo,"call Address({},{},{})",&this->type_,
             &this->addr_type_,bech32_hrp);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey, const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(),
      script_tree_(tree),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  schnorr_pubkey_ = tree.GetTweakedPubkey(internal_pubkey);
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}